

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

void __thiscall Cmd::refreshSingleLine(Cmd *this,State *state)

{
  size_type sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  size_type sVar6;
  ulong uVar7;
  string ab;
  char seq [64];
  string local_98;
  char local_78 [72];
  
  sVar1 = (this->prompt)._M_string_length;
  pcVar5 = (state->buf)._M_dataplus._M_p;
  sVar6 = (state->buf)._M_string_length;
  sVar2 = state->pos;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  uVar3 = state->cols;
  uVar7 = sVar2 + sVar1;
  if (uVar3 <= uVar7) {
    uVar4 = (sVar2 + sVar1) - 1;
    uVar7 = uVar3 - 1;
    if (uVar4 < uVar3 - 1) {
      uVar7 = uVar4;
    }
    sVar6 = (sVar6 + uVar7) - (sVar2 + sVar1);
    pcVar5 = pcVar5 + ((sVar2 + sVar1) - uVar7);
  }
  uVar4 = sVar6 + sVar1;
  if (uVar3 < sVar6 + sVar1) {
    uVar4 = uVar3;
  }
  std::__cxx11::string::append((char *)&local_98);
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)(this->prompt)._M_dataplus._M_p);
  if (state->mask_mode == true) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)&local_98,local_98._M_string_length,0,(char)uVar4 - (char)sVar1);
  }
  else {
    std::__cxx11::string::append((char *)&local_98,(ulong)pcVar5);
  }
  refreshShowHints(this,&local_98,state,(int)sVar1);
  std::__cxx11::string::append((char *)&local_98);
  snprintf(local_78,0x40,"\r\x1b[%dC",uVar7 & 0xffffffff);
  std::__cxx11::string::append((char *)&local_98);
  write(this->out_fd_,local_98._M_dataplus._M_p,local_98._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void refreshSingleLine(State *state) {
		char seq[64];
		const size_t plen = prompt.size();
		std::string_view buf_view(state->buf);
		size_t pos = state->pos;
		std::string ab;

		while (plen + pos >= state->cols) {
			buf_view.remove_prefix(1);
			pos--;
		}

		while (plen + buf_view.size() > state->cols) {
			buf_view.remove_suffix(1);
		}

		// Cursor to left edge
		ab.append("\r");

		// Write the prompt and the current buffer content
		ab.append(prompt);

		if (state->mask_mode) {
			ab.append(buf_view.size(), '*');
		} else {
			ab.append(buf_view);
		}
		// Show hits if any.
		refreshShowHints(ab, state, plen);

		// Erase to right
		ab.append("\x1b[0K");

		// Move cursor to original position.
		snprintf(seq, sizeof(seq), "\r\x1b[%dC", static_cast<int>(pos + plen));
		ab.append(seq);

		write_string(ab);
	}